

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetLinkLibrariesCommand::HandleLibrary
          (cmTargetLinkLibrariesCommand *this,string *lib,cmTargetLinkLibraryType llt)

{
  cmMakefile *pcVar1;
  MessageType t_00;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  string *psVar5;
  cmTarget *pcVar6;
  ostream *poVar7;
  cmGlobalGenerator *this_00;
  char *pcVar8;
  size_type sVar9;
  cmake *this_01;
  reference pbVar10;
  PolicyID id;
  bool local_789;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_770;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_768;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_760;
  const_iterator i_1;
  string local_750;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_730;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_728;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_720;
  const_iterator i;
  string prop;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  undefined1 local_6d8 [4];
  PolicyStatus policy22Status;
  allocator local_6b1;
  string local_6b0;
  allocator local_689;
  string local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  undefined1 local_628 [8];
  string configLib;
  allocator local_5e1;
  string local_5e0;
  string local_5c0;
  ostringstream local_5a0 [8];
  ostringstream e_2;
  cmTarget *tgt;
  ostringstream local_400 [8];
  ostringstream e_1;
  cmTarget *t;
  string local_278;
  char *local_258;
  char *existingSig;
  MessageType local_22c;
  char *pcStack_228;
  MessageType messageType;
  char *modal;
  ostringstream e;
  cmListFileContext local_a8;
  TLLSignature local_60;
  TLLSignature sig;
  allocator local_49;
  string local_48;
  cmTargetLinkLibraryType local_24;
  string *psStack_20;
  cmTargetLinkLibraryType llt_local;
  string *lib_local;
  cmTargetLinkLibrariesCommand *this_local;
  
  local_24 = llt;
  psStack_20 = lib;
  lib_local = (string *)this;
  TVar3 = cmTarget::GetType(this->Target);
  if ((TVar3 == INTERFACE_LIBRARY) &&
     (this->CurrentProcessingState != ProcessingKeywordLinkInterface)) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,
               "INTERFACE library can only be used with the INTERFACE keyword of target_link_libraries"
               ,&local_49);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_007f44a9;
  }
  local_789 = true;
  if ((((this->CurrentProcessingState != ProcessingPlainPrivateInterface) &&
       (local_789 = true, this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
      (local_789 = true, this->CurrentProcessingState != ProcessingKeywordPrivateInterface)) &&
     (local_789 = true, this->CurrentProcessingState != ProcessingKeywordPublicInterface)) {
    local_789 = this->CurrentProcessingState == ProcessingKeywordLinkInterface;
  }
  pcVar6 = this->Target;
  local_60 = (byte)~local_789 & PlainTLLSignature;
  cmMakefile::GetExecutionContext(&local_a8,(this->super_cmCommand).Makefile);
  bVar2 = cmTarget::PushTLLCommandTrace(pcVar6,(byte)~local_789 & PlainTLLSignature,&local_a8);
  cmListFileContext::~cmListFileContext(&local_a8);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&modal);
    pcStack_228 = (char *)0x0;
    local_22c = AUTHOR_WARNING;
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0023);
    if (PVar4 != OLD) {
      if (PVar4 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&existingSig,(cmPolicies *)0x17,id);
        poVar7 = std::operator<<((ostream *)&modal,(string *)&existingSig);
        std::operator<<(poVar7,"\n");
        std::__cxx11::string::~string((string *)&existingSig);
        pcStack_228 = "should";
      }
      else if (PVar4 - NEW < 3) {
        pcStack_228 = "must";
        local_22c = FATAL_ERROR;
      }
    }
    if (pcStack_228 == (char *)0x0) {
LAB_007f3931:
      bVar2 = false;
    }
    else {
      local_258 = "keyword";
      if (local_60 == KeywordTLLSignature) {
        local_258 = "plain";
      }
      poVar7 = std::operator<<((ostream *)&modal,"The ");
      poVar7 = std::operator<<(poVar7,local_258);
      poVar7 = std::operator<<(poVar7,
                               " signature for target_link_libraries has already been used with the target \""
                              );
      psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar7 = std::operator<<(poVar7,(string *)psVar5);
      poVar7 = std::operator<<(poVar7,"\".  All uses of target_link_libraries with a target ");
      poVar7 = std::operator<<(poVar7,pcStack_228);
      std::operator<<(poVar7," be either all-keyword or all-plain.\n");
      cmTarget::GetTllSignatureTraces
                (this->Target,(ostream *)&modal,(uint)(local_60 == KeywordTLLSignature));
      t_00 = local_22c;
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,t_00,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      if (local_22c != FATAL_ERROR) goto LAB_007f3931;
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&modal);
    if (bVar2) goto LAB_007f44a9;
  }
  if ((this->CurrentProcessingState != ProcessingKeywordLinkInterface) &&
     (this->CurrentProcessingState != ProcessingPlainLinkInterface)) {
    pcVar1 = (this->super_cmCommand).Makefile;
    psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
    pcVar6 = cmMakefile::FindLocalNonAliasTarget(pcVar1,psVar5);
    if (pcVar6 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_400);
      poVar7 = std::operator<<((ostream *)local_400,"Attempt to add link library \"");
      poVar7 = std::operator<<(poVar7,(string *)psStack_20);
      poVar7 = std::operator<<(poVar7,"\" to target \"");
      psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar7 = std::operator<<(poVar7,(string *)psVar5);
      std::operator<<(poVar7,"\" which is not built in this directory.");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&tgt);
      std::__cxx11::string::~string((string *)&tgt);
      std::__cxx11::ostringstream::~ostringstream(local_400);
    }
    else {
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      pcVar6 = cmGlobalGenerator::FindTarget(this_00,psStack_20,false);
      if (((pcVar6 != (cmTarget *)0x0) &&
          (TVar3 = cmTarget::GetType(pcVar6), TVar3 != STATIC_LIBRARY)) &&
         ((TVar3 = cmTarget::GetType(pcVar6), TVar3 != SHARED_LIBRARY &&
          ((TVar3 = cmTarget::GetType(pcVar6), TVar3 != INTERFACE_LIBRARY &&
           (bVar2 = cmTarget::IsExecutableWithExports(pcVar6), !bVar2)))))) {
        std::__cxx11::ostringstream::ostringstream(local_5a0);
        poVar7 = std::operator<<((ostream *)local_5a0,"Target \"");
        poVar7 = std::operator<<(poVar7,(string *)psStack_20);
        poVar7 = std::operator<<(poVar7,"\" of type ");
        TVar3 = cmTarget::GetType(pcVar6);
        pcVar8 = cmState::GetTargetTypeName(TVar3);
        poVar7 = std::operator<<(poVar7,pcVar8);
        poVar7 = std::operator<<(poVar7," may not be linked into another target.  ");
        poVar7 = std::operator<<(poVar7,"One may link only to STATIC or SHARED libraries, or ");
        std::operator<<(poVar7,"to executables with the ENABLE_EXPORTS property set.");
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_5c0);
        std::__cxx11::string::~string((string *)&local_5c0);
        std::__cxx11::ostringstream::~ostringstream(local_5a0);
      }
      cmTarget::AddLinkLibrary(this->Target,(this->super_cmCommand).Makefile,psStack_20,local_24);
    }
    if (this->CurrentProcessingState == ProcessingLinkLibraries) {
      pcVar6 = this->Target;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5e0,"INTERFACE_LINK_LIBRARIES",&local_5e1);
      cmTarget::GetDebugGeneratorExpressions
                ((string *)((long)&configLib.field_2 + 8),this->Target,psStack_20,local_24);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmTarget::AppendProperty(pcVar6,&local_5e0,pcVar8,false);
      std::__cxx11::string::~string((string *)(configLib.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      this_local._7_1_ = 1;
      goto LAB_007f44a9;
    }
    if ((this->CurrentProcessingState != ProcessingKeywordPublicInterface) &&
       (this->CurrentProcessingState != ProcessingPlainPublicInterface)) {
      TVar3 = cmTarget::GetType(this->Target);
      if (TVar3 == STATIC_LIBRARY) {
        cmTarget::GetDebugGeneratorExpressions((string *)local_628,this->Target,psStack_20,local_24)
        ;
        bVar2 = cmGeneratorExpression::IsValidTargetName(psStack_20);
        if ((bVar2) ||
           (sVar9 = cmGeneratorExpression::Find(psStack_20), sVar9 != 0xffffffffffffffff)) {
          std::operator+(&local_668,"$<LINK_ONLY:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_628);
          std::operator+(&local_648,&local_668,">");
          std::__cxx11::string::operator=((string *)local_628,(string *)&local_648);
          std::__cxx11::string::~string((string *)&local_648);
          std::__cxx11::string::~string((string *)&local_668);
        }
        pcVar6 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_688,"INTERFACE_LINK_LIBRARIES",&local_689);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmTarget::AppendProperty(pcVar6,&local_688,pcVar8,false);
        std::__cxx11::string::~string((string *)&local_688);
        std::allocator<char>::~allocator((allocator<char> *)&local_689);
        std::__cxx11::string::~string((string *)local_628);
      }
      this_local._7_1_ = 1;
      goto LAB_007f44a9;
    }
  }
  pcVar6 = this->Target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6b0,"INTERFACE_LINK_LIBRARIES",&local_6b1);
  cmTarget::GetDebugGeneratorExpressions((string *)local_6d8,this->Target,psStack_20,local_24);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmTarget::AppendProperty(pcVar6,&local_6b0,pcVar8,false);
  std::__cxx11::string::~string((string *)local_6d8);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  PVar4 = cmTarget::GetPolicyStatusCMP0022(this->Target);
  if ((PVar4 == OLD) || (PVar4 == WARN)) {
    TVar3 = cmTarget::GetType(this->Target);
    if (TVar3 == INTERFACE_LIBRARY) {
      this_local._7_1_ = 1;
    }
    else {
      this_01 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      cmake::GetDebugConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&prop.field_2 + 8),this_01);
      std::__cxx11::string::string((string *)&i);
      if ((local_24 == DEBUG_LibraryType) || (local_24 == GENERAL_LibraryType)) {
        local_728._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_720,&local_728);
        while( true ) {
          local_730._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
          bVar2 = __gnu_cxx::operator!=(&local_720,&local_730);
          if (!bVar2) break;
          std::__cxx11::string::operator=((string *)&i,"LINK_INTERFACE_LIBRARIES_");
          pbVar10 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_720);
          std::__cxx11::string::operator+=((string *)&i,(string *)pbVar10);
          pcVar6 = this->Target;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmTarget::AppendProperty(pcVar6,(string *)&i,pcVar8,false);
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_720);
        }
      }
      if ((local_24 == OPTIMIZED_LibraryType) || (local_24 == GENERAL_LibraryType)) {
        pcVar6 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_750,"LINK_INTERFACE_LIBRARIES",
                   (allocator *)((long)&i_1._M_current + 7));
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmTarget::AppendProperty(pcVar6,&local_750,pcVar8,false);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
        local_768._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_760,&local_768);
        while( true ) {
          local_770._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&prop.field_2 + 8));
          bVar2 = __gnu_cxx::operator!=(&local_760,&local_770);
          if (!bVar2) break;
          std::__cxx11::string::operator=((string *)&i,"LINK_INTERFACE_LIBRARIES_");
          pbVar10 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_760);
          std::__cxx11::string::operator+=((string *)&i,(string *)pbVar10);
          pcVar8 = cmTarget::GetProperty(this->Target,(string *)&i);
          if (pcVar8 == (char *)0x0) {
            cmTarget::SetProperty(this->Target,(string *)&i,"");
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_760);
        }
      }
      this_local._7_1_ = 1;
      std::__cxx11::string::~string((string *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&prop.field_2 + 8));
    }
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_007f44a9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTargetLinkLibrariesCommand::HandleLibrary(const std::string& lib,
                                                 cmTargetLinkLibraryType llt)
{
  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "INTERFACE library can only be used with the INTERFACE keyword of "
      "target_link_libraries");
    return false;
  }

  cmTarget::TLLSignature sig =
    (this->CurrentProcessingState == ProcessingPlainPrivateInterface ||
     this->CurrentProcessingState == ProcessingPlainPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordPrivateInterface ||
     this->CurrentProcessingState == ProcessingKeywordPublicInterface ||
     this->CurrentProcessingState == ProcessingKeywordLinkInterface)
    ? cmTarget::KeywordTLLSignature
    : cmTarget::PlainTLLSignature;
  if (!this->Target->PushTLLCommandTrace(
        sig, this->Makefile->GetExecutionContext())) {
    std::ostringstream e;
    const char* modal = CM_NULLPTR;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0023)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0023) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = cmake::FATAL_ERROR;
    }

    if (modal) {
      // If the sig is a keyword form and there is a conflict, the existing
      // form must be the plain form.
      const char* existingSig =
        (sig == cmTarget::KeywordTLLSignature ? "plain" : "keyword");
      e << "The " << existingSig << " signature for target_link_libraries "
                                    "has already been used with the target \""
        << this->Target->GetName() << "\".  All uses of "
                                      "target_link_libraries with a target "
        << modal << " be either "
                    "all-keyword or all-plain.\n";
      this->Target->GetTllSignatureTraces(e,
                                          sig == cmTarget::KeywordTLLSignature
                                            ? cmTarget::PlainTLLSignature
                                            : cmTarget::KeywordTLLSignature);
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  // Handle normal case first.
  if (this->CurrentProcessingState != ProcessingKeywordLinkInterface &&
      this->CurrentProcessingState != ProcessingPlainLinkInterface) {

    cmTarget* t =
      this->Makefile->FindLocalNonAliasTarget(this->Target->GetName());
    if (!t) {
      std::ostringstream e;
      e << "Attempt to add link library \"" << lib << "\" to target \""
        << this->Target->GetName()
        << "\" which is not built in this directory.";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    } else {

      cmTarget* tgt = this->Makefile->GetGlobalGenerator()->FindTarget(lib);

      if (tgt && (tgt->GetType() != cmStateEnums::STATIC_LIBRARY) &&
          (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) &&
          (tgt->GetType() != cmStateEnums::INTERFACE_LIBRARY) &&
          !tgt->IsExecutableWithExports()) {
        std::ostringstream e;
        e << "Target \"" << lib << "\" of type "
          << cmState::GetTargetTypeName(tgt->GetType())
          << " may not be linked into another target.  "
          << "One may link only to STATIC or SHARED libraries, or "
          << "to executables with the ENABLE_EXPORTS property set.";
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      }

      this->Target->AddLinkLibrary(*this->Makefile, lib, llt);
    }

    if (this->CurrentProcessingState == ProcessingLinkLibraries) {
      this->Target->AppendProperty(
        "INTERFACE_LINK_LIBRARIES",
        this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());
      return true;
    }
    if (this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
        this->CurrentProcessingState != ProcessingPlainPublicInterface) {
      if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
        std::string configLib =
          this->Target->GetDebugGeneratorExpressions(lib, llt);
        if (cmGeneratorExpression::IsValidTargetName(lib) ||
            cmGeneratorExpression::Find(lib) != std::string::npos) {
          configLib = "$<LINK_ONLY:" + configLib + ">";
        }
        this->Target->AppendProperty("INTERFACE_LINK_LIBRARIES",
                                     configLib.c_str());
      }
      // Not a 'public' or 'interface' library. Do not add to interface
      // property.
      return true;
    }
  }

  this->Target->AppendProperty(
    "INTERFACE_LINK_LIBRARIES",
    this->Target->GetDebugGeneratorExpressions(lib, llt).c_str());

  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();

  if (policy22Status != cmPolicies::OLD &&
      policy22Status != cmPolicies::WARN) {
    return true;
  }

  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return true;
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();
  std::string prop;

  // Include this library in the link interface for the target.
  if (llt == DEBUG_LibraryType || llt == GENERAL_LibraryType) {
    // Put in the DEBUG configuration interfaces.
    for (std::vector<std::string>::const_iterator i = debugConfigs.begin();
         i != debugConfigs.end(); ++i) {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      this->Target->AppendProperty(prop, lib.c_str());
    }
  }
  if (llt == OPTIMIZED_LibraryType || llt == GENERAL_LibraryType) {
    // Put in the non-DEBUG configuration interfaces.
    this->Target->AppendProperty("LINK_INTERFACE_LIBRARIES", lib.c_str());

    // Make sure the DEBUG configuration interfaces exist so that the
    // general one will not be used as a fall-back.
    for (std::vector<std::string>::const_iterator i = debugConfigs.begin();
         i != debugConfigs.end(); ++i) {
      prop = "LINK_INTERFACE_LIBRARIES_";
      prop += *i;
      if (!this->Target->GetProperty(prop)) {
        this->Target->SetProperty(prop, "");
      }
    }
  }
  return true;
}